

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

Vector * __thiscall Sphere::find_normal(Vector *__return_storage_ptr__,Sphere *this,Vector *p)

{
  Vector local_38;
  Vector *local_20;
  Vector *p_local;
  Sphere *this_local;
  
  local_20 = p;
  p_local = (Vector *)this;
  this_local = (Sphere *)__return_storage_ptr__;
  operator-(&local_38,p,&this->loc);
  operator/(__return_storage_ptr__,&local_38,this->radius);
  return __return_storage_ptr__;
}

Assistant:

Vector Sphere::find_normal(   Vector&  p )
{
   return (p - loc) / radius;
}